

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

secp256k1_context * secp256k1_context_preallocated_create(void *prealloc,uint flags)

{
  int iVar1;
  size_t max_size;
  secp256k1_ecmult_context *ctx;
  secp256k1_context *ret;
  size_t prealloc_size;
  void *base;
  void *pvStack_18;
  uint flags_local;
  void *prealloc_local;
  
  pvStack_18 = prealloc;
  iVar1 = secp256k1_selftest();
  if (iVar1 == 0) {
    secp256k1_callback_call(&default_error_callback,"self test failed");
  }
  max_size = secp256k1_context_preallocated_size(flags);
  if (max_size == 0) {
    prealloc_local = (void *)0x0;
  }
  else {
    ctx = (secp256k1_ecmult_context *)manual_alloc(&stack0xffffffffffffffe8,0xe0,prealloc,max_size);
    ctx[0xb].pre_g_128 = secp256k1_default_illegal_callback_fn;
    ctx[0xc].pre_g = (secp256k1_ge_storage_0_ *)(void *)0x0;
    ctx[0xc].pre_g_128 = secp256k1_default_error_callback_fn;
    ctx[0xd].pre_g = (secp256k1_ge_storage_0_ *)(void *)0x0;
    secp256k1_ecmult_context_init(ctx);
    secp256k1_ecmult_gen_context_init((secp256k1_ecmult_gen_context *)(ctx + 1));
    if ((flags & 0x200) != 0) {
      secp256k1_ecmult_gen_context_build
                ((secp256k1_ecmult_gen_context *)(ctx + 1),&stack0xffffffffffffffe8);
    }
    if ((flags & 0x100) != 0) {
      secp256k1_ecmult_context_build(ctx,&stack0xffffffffffffffe8);
    }
    *(uint *)&ctx[0xd].pre_g_128 = (uint)((flags & 0x400) != 0);
    prealloc_local = ctx;
  }
  return (secp256k1_context *)prealloc_local;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_create(void* prealloc, unsigned int flags) {
    void* const base = prealloc;
    size_t prealloc_size;
    secp256k1_context* ret;

    if (!secp256k1_selftest()) {
        secp256k1_callback_call(&default_error_callback, "self test failed");
    }

    prealloc_size = secp256k1_context_preallocated_size(flags);
    if (prealloc_size == 0) {
        return NULL;
    }
    VERIFY_CHECK(prealloc != NULL);
    ret = (secp256k1_context*)manual_alloc(&prealloc, sizeof(secp256k1_context), base, prealloc_size);
    ret->illegal_callback = default_illegal_callback;
    ret->error_callback = default_error_callback;

    secp256k1_ecmult_context_init(&ret->ecmult_ctx);
    secp256k1_ecmult_gen_context_init(&ret->ecmult_gen_ctx);

    /* Flags have been checked by secp256k1_context_preallocated_size. */
    VERIFY_CHECK((flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_CONTEXT);
    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_SIGN) {
        secp256k1_ecmult_gen_context_build(&ret->ecmult_gen_ctx, &prealloc);
    }
    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_VERIFY) {
        secp256k1_ecmult_context_build(&ret->ecmult_ctx, &prealloc);
    }
    ret->declassify = !!(flags & SECP256K1_FLAGS_BIT_CONTEXT_DECLASSIFY);

    return (secp256k1_context*) ret;
}